

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O3

bool validate_xfb_offset_qualifier
               (YYLTYPE *loc,_mesa_glsl_parse_state *state,int xfb_offset,glsl_type *type,
               uint component_size)

{
  byte bVar1;
  glsl_type *pgVar2;
  glsl_type *this;
  bool bVar3;
  glsl_type *pgVar4;
  long lVar5;
  ulong uVar6;
  
  bVar1 = type->field_0x4;
  pgVar2 = type;
  while (bVar1 == 0x11) {
    pgVar2 = (pgVar2->fields).array;
    bVar1 = pgVar2->field_0x4;
  }
  if (((xfb_offset == -1) || (type->field_0x4 != 0x11)) || (type->length != 0)) {
    if ((bVar1 - 0xf < 2) && (pgVar2->length != 0)) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pgVar4 = (pgVar2->fields).array;
        this = *(glsl_type **)((long)&pgVar4->gl_type + lVar5);
        if (xfb_offset == -1) {
          bVar3 = glsl_type::contains_double(this);
          component_size = (uint)bVar3 * 4 + 4;
          pgVar4 = (pgVar2->fields).array;
        }
        validate_xfb_offset_qualifier
                  (loc,state,*(int *)((long)&pgVar4->name + lVar5 + 4),this,component_size);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar6 < pgVar2->length);
    }
    bVar3 = true;
    if ((xfb_offset != -1) && ((uint)xfb_offset % component_size != 0)) {
      bVar3 = false;
      _mesa_glsl_error(loc,state,
                       "invalid qualifier xfb_offset=%d must be a multiple of the first component size of the first qualified variable or block member. Or double if an aggregate that contains a double (%d)."
                       ,(ulong)(uint)xfb_offset,(ulong)component_size);
    }
  }
  else {
    bVar3 = false;
    _mesa_glsl_error(loc,state,"xfb_offset can\'t be used with unsized arrays.");
  }
  return bVar3;
}

Assistant:

static bool
validate_xfb_offset_qualifier(YYLTYPE *loc,
                              struct _mesa_glsl_parse_state *state,
                              int xfb_offset, const glsl_type *type,
                              unsigned component_size) {
  const glsl_type *t_without_array = type->without_array();

   if (xfb_offset != -1 && type->is_unsized_array()) {
      _mesa_glsl_error(loc, state,
                       "xfb_offset can't be used with unsized arrays.");
      return false;
   }

   /* Make sure nested structs don't contain unsized arrays, and validate
    * any xfb_offsets on interface members.
    */
   if (t_without_array->is_struct() || t_without_array->is_interface())
      for (unsigned int i = 0; i < t_without_array->length; i++) {
         const glsl_type *member_t = t_without_array->fields.structure[i].type;

         /* When the interface block doesn't have an xfb_offset qualifier then
          * we apply the component size rules at the member level.
          */
         if (xfb_offset == -1)
            component_size = member_t->contains_double() ? 8 : 4;

         int xfb_offset = t_without_array->fields.structure[i].offset;
         validate_xfb_offset_qualifier(loc, state, xfb_offset, member_t,
                                       component_size);
      }

  /* Nested structs or interface block without offset may not have had an
   * offset applied yet so return.
   */
   if (xfb_offset == -1) {
     return true;
   }

   if (xfb_offset % component_size) {
      _mesa_glsl_error(loc, state,
                       "invalid qualifier xfb_offset=%d must be a multiple "
                       "of the first component size of the first qualified "
                       "variable or block member. Or double if an aggregate "
                       "that contains a double (%d).",
                       xfb_offset, component_size);
      return false;
   }

   return true;
}